

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O2

int secp256k1_fe_impl_is_square_var(secp256k1_fe *x)

{
  uint uVar1;
  uint64_t *t;
  secp256k1_fe tmp;
  secp256k1_fe dummy;
  secp256k1_modinv64_signed62 s;
  
  tmp.n[0] = x->n[0];
  tmp.n[1] = x->n[1];
  tmp.n[2] = x->n[2];
  tmp.n[3] = x->n[3];
  tmp.n[4] = x->n[4];
  secp256k1_fe_impl_normalize_var(&tmp);
  if (((tmp.n[1] == 0 && tmp.n[3] == 0) && (tmp.n[0] == 0 && tmp.n[2] == 0)) && tmp.n[4] == 0) {
    uVar1 = 1;
  }
  else {
    secp256k1_fe_to_signed62(&s,&tmp);
    uVar1 = secp256k1_jacobi64_maybe_var(&s,&secp256k1_const_modinfo_fe);
    if (uVar1 == 0) {
      uVar1 = secp256k1_fe_sqrt(&dummy,&tmp);
    }
    else {
      uVar1 = ~uVar1 >> 0x1f;
    }
  }
  return uVar1;
}

Assistant:

static int secp256k1_fe_impl_is_square_var(const secp256k1_fe *x) {
    secp256k1_fe tmp;
    secp256k1_modinv64_signed62 s;
    int jac, ret;

    tmp = *x;
    secp256k1_fe_normalize_var(&tmp);
    /* secp256k1_jacobi64_maybe_var cannot deal with input 0. */
    if (secp256k1_fe_is_zero(&tmp)) return 1;
    secp256k1_fe_to_signed62(&s, &tmp);
    jac = secp256k1_jacobi64_maybe_var(&s, &secp256k1_const_modinfo_fe);
    if (jac == 0) {
        /* secp256k1_jacobi64_maybe_var failed to compute the Jacobi symbol. Fall back
         * to computing a square root. This should be extremely rare with random
         * input (except in VERIFY mode, where a lower iteration count is used). */
        secp256k1_fe dummy;
        ret = secp256k1_fe_sqrt(&dummy, &tmp);
    } else {
        ret = jac >= 0;
    }
    return ret;
}